

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O0

string * HN::parseHTML(string *str)

{
  bool bVar1;
  string *in_RDI;
  char *ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  bool inTag;
  string *res;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffac8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffae0;
  string *replace;
  string *in_stack_fffffffffffffae8;
  string *search;
  string *in_stack_fffffffffffffaf0;
  string *s;
  allocator<char> *in_stack_fffffffffffffb00;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb08;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_449;
  string local_448 [39];
  allocator<char> local_421;
  string local_420 [39];
  allocator<char> local_3f9;
  string local_3f8 [39];
  undefined1 local_3d1 [40];
  undefined1 local_3a9 [40];
  undefined1 local_381 [40];
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [39];
  undefined1 local_2e1 [40];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [32];
  reference local_90;
  undefined8 local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [2];
  byte local_6b;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_6a = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_6b = 0;
  local_80[0]._M_current = (char *)std::__cxx11::string::begin();
  local_88 = std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8), bVar1)
  {
    local_90 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_80);
    if (*local_90 == '<') {
      local_6b = 1;
    }
    else if (*local_90 == '>') {
      local_6b = 0;
    }
    else if ((local_6b & 1) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,*local_90);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  __s = &local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffb00);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::~string((string *)(local_2e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2e1);
  __a = &local_331;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  anon_unknown.dwarf_216a9::replaceAll
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  s = (string *)local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  search = (string *)local_3a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  anon_unknown.dwarf_216a9::replaceAll(s,search,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string((string *)(local_3a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3a9);
  std::__cxx11::string::~string((string *)(local_381 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_381);
  replace = (string *)local_3d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  anon_unknown.dwarf_216a9::replaceAll(s,search,replace);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::string::~string((string *)(local_3d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  anon_unknown.dwarf_216a9::replaceAll(s,search,replace);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator(&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator(&local_421);
  return in_RDI;
}

Assistant:

std::string parseHTML(std::string str) {
        ::replaceAll(str, "<p>", "\n");

        std::string res;
        bool inTag = false;
        for (auto & ch : str) {
            if (ch == '<') {
                inTag = true;
            } else if (ch == '>') {
                inTag = false;
            } else {
                if (inTag == false) {
                    res += ch;
                }
            }
        }

        ::replaceAll(res, "&#x2F;", "/");
        ::replaceAll(res, "&#x27;", "'");
        ::replaceAll(res, "&gt;", ">");
        ::replaceAll(res, "–", "-");
        ::replaceAll(res, "“", "\"");
        ::replaceAll(res, "”", "\"");
        ::replaceAll(res, "‘", "'");
        ::replaceAll(res, "’", "'");
        ::replaceAll(res, "„", "'");
        ::replaceAll(res, "&quot;", "\"");
        ::replaceAll(res, "&amp;", "&");
        ::replaceAll(res, "—", "-");

        return res;
    }